

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTestCaseBase.cpp
# Opt level: O0

void __thiscall
glcts::TestCaseBase::TestCaseBase
          (TestCaseBase *this,Context *context,ExtParameters *extParam,char *name,char *description)

{
  TestContext *testCtx;
  RenderContext *pRVar1;
  int local_34;
  char *local_30;
  char *description_local;
  char *name_local;
  ExtParameters *extParam_local;
  Context *context_local;
  TestCaseBase *this_local;
  
  local_30 = description;
  description_local = name;
  name_local = (char *)extParam;
  extParam_local = (ExtParameters *)context;
  context_local = (Context *)this;
  testCtx = deqp::Context::getTestContext(context);
  tcu::TestCase::TestCase(&this->super_TestCase,testCtx,description_local,local_30);
  (this->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCaseBase_0325e3c8;
  this->m_context = (Context *)extParam_local;
  this->m_glslVersion = *(GLSLVersion *)name_local;
  this->m_extType = *(ExtensionType *)(name_local + 4);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->m_specializationMap);
  this->m_is_framebuffer_no_attachments_supported = false;
  this->m_is_geometry_shader_extension_supported = false;
  this->m_is_geometry_shader_point_size_supported = false;
  this->m_is_gpu_shader5_supported = false;
  this->m_is_program_interface_query_supported = false;
  this->m_is_shader_image_load_store_supported = false;
  this->m_is_shader_image_atomic_supported = false;
  this->m_is_texture_storage_multisample_supported = false;
  this->m_is_texture_storage_multisample_2d_array_supported = false;
  this->m_is_tessellation_shader_supported = false;
  this->m_is_tessellation_shader_point_size_supported = false;
  this->m_is_texture_cube_map_array_supported = false;
  this->m_is_texture_border_clamp_supported = false;
  this->m_is_texture_buffer_supported = false;
  this->m_is_viewport_array_supported = false;
  this->seed_value = 1;
  pRVar1 = deqp::Context::getRenderContext((Context *)extParam_local);
  local_34 = (*pRVar1->_vptr_RenderContext[2])();
  deqp::GLExtTokens::init(&this->m_glExtTokens,(EVP_PKEY_CTX *)&local_34);
  return;
}

Assistant:

TestCaseBase::TestCaseBase(Context& context, const ExtParameters& extParam, const char* name, const char* description)
	: tcu::TestCase(context.getTestContext(), name, description)
	, m_context(context)
	, m_glslVersion(extParam.glslVersion)
	, m_extType(extParam.extType)
	, m_is_framebuffer_no_attachments_supported(false)
	, m_is_geometry_shader_extension_supported(false)
	, m_is_geometry_shader_point_size_supported(false)
	, m_is_gpu_shader5_supported(false)
	, m_is_program_interface_query_supported(false)
	, m_is_shader_image_load_store_supported(false)
	, m_is_shader_image_atomic_supported(false)
	, m_is_texture_storage_multisample_supported(false)
	, m_is_texture_storage_multisample_2d_array_supported(false)
	, m_is_tessellation_shader_supported(false)
	, m_is_tessellation_shader_point_size_supported(false)
	, m_is_texture_cube_map_array_supported(false)
	, m_is_texture_border_clamp_supported(false)
	, m_is_texture_buffer_supported(false)
	, m_is_viewport_array_supported(false)
	, seed_value(1)
{
	m_glExtTokens.init(context.getRenderContext().getType());
}